

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getBasisInverseCol
          (Highs *this,HighsInt col,double *col_vector,HighsInt *col_num_nz,HighsInt *col_indices)

{
  reference pvVar1;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  vector<double,_std::allocator<double>_> rhs;
  bool in_stack_00000067;
  HighsInt *in_stack_00000068;
  HighsInt *in_stack_00000070;
  double *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  HighsInt num_row;
  size_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  Highs *this_01;
  vector<double,_std::allocator<double>_> local_88;
  undefined1 local_59 [37];
  int local_34;
  uint local_14;
  HighsStatus local_4;
  
  if (in_RDX == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "getBasisInverseCol: col_vector is NULL\n");
    local_4 = kError;
  }
  else {
    local_34 = *(int *)(in_RDI + 0x13c);
    if (((int)in_ESI < 0) || (local_34 <= (int)in_ESI)) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Column index %d out of range [0, %d] in getBasisInverseCol\n",(ulong)in_ESI,
                   (ulong)(local_34 - 1));
      local_4 = kError;
    }
    else if ((*(byte *)(in_RDI + 0x3850) & 1) == 0) {
      this_01 = (Highs *)local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_59 + 1),"getBasisInverseCol",(allocator *)this_01);
      local_4 = invertRequirementError
                          (this_01,(string *)
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      std::__cxx11::string::~string((string *)(local_59 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_59);
    }
    else {
      this_00 = &local_88;
      local_14 = in_ESI;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x48fa19);
      std::vector<double,_std::allocator<double>_>::assign
                (this_00,in_stack_ffffffffffffff48,(value_type_conflict1 *)0x48fa39);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_88,(long)(int)local_14);
      *pvVar1 = 1.0;
      basisSolveInterface((Highs *)col_indices,in_stack_00000080,in_stack_00000078,in_stack_00000070
                          ,in_stack_00000068,in_stack_00000067);
      local_4 = kOk;
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff60);
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getBasisInverseCol(const HighsInt col, double* col_vector,
                                      HighsInt* col_num_nz,
                                      HighsInt* col_indices) {
  if (col_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasisInverseCol: col_vector is NULL\n");
    return HighsStatus::kError;
  }
  // col_indices can be NULL - it's the trigger that determines
  // whether they are identified or not
  HighsInt num_row = model_.lp_.num_row_;
  if (col < 0 || col >= num_row) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Column index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT
                 "] in getBasisInverseCol\n",
                 col, num_row - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisInverseCol");
  // Compute a col i of the inverse of the basis matrix by solving Bx=e_i
  vector<double> rhs;
  rhs.assign(num_row, 0);
  rhs[col] = 1;
  basisSolveInterface(rhs, col_vector, col_num_nz, col_indices, false);
  return HighsStatus::kOk;
}